

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWec.h
# Opt level: O1

void Vec_WecFree(Vec_Wec_t *p)

{
  void *__ptr;
  long lVar1;
  long lVar2;
  
  if (0 < p->nCap) {
    lVar1 = 8;
    lVar2 = 0;
    do {
      __ptr = *(void **)((long)&p->pArray->nCap + lVar1);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&p->pArray->nCap + lVar1) = 0;
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (lVar2 < p->nCap);
  }
  if (p->pArray != (Vec_Int_t *)0x0) {
    free(p->pArray);
    p->pArray = (Vec_Int_t *)0x0;
  }
  p->nCap = 0;
  p->nSize = 0;
  free(p);
  return;
}

Assistant:

static inline void Vec_WecFree( Vec_Wec_t * p )
{
    Vec_WecErase( p );
    ABC_FREE( p );
}